

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetSpan(Parse *pParse,ExprList *pList,ExprSpan *pSpan)

{
  void *p;
  char *pcVar1;
  sqlite3 *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  ExprList_item *pItem;
  sqlite3 *db;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)*in_RDI;
  if (in_RSI != (int *)0x0) {
    p = (void *)(*(long *)(in_RSI + 2) + (long)(*in_RSI + -1) * 0x20);
    sqlite3DbFree(db_00,p);
    pcVar1 = sqlite3DbStrNDup(in_RDX,(char *)db_00,(u64)p);
    *(char **)((long)p + 0x10) = pcVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetSpan(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  ExprSpan *pSpan         /* The span to be added */
){
  sqlite3 *db = pParse->db;
  assert( pList!=0 || db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr-1];
    assert( pList->nExpr>0 );
    assert( db->mallocFailed || pItem->pExpr==pSpan->pExpr );
    sqlite3DbFree(db, pItem->zSpan);
    pItem->zSpan = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                    (int)(pSpan->zEnd - pSpan->zStart));
  }
}